

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyPacked
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix,
          Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
          *checkUnpacked)

{
  byte bVar1;
  WiderType<Decay<unsigned_int_&>,_Decay<unsigned_long_&>_> WVar2;
  Repeat<unsigned_char> RVar3;
  ArrayPtr<const_unsigned_char> params;
  unsigned_long uStack_a8;
  uint n;
  size_t available;
  uint count_1;
  size_t local_90;
  int local_88;
  int local_84;
  uint count;
  byte local_79;
  uint local_78;
  byte b;
  uint i;
  byte tag;
  byte *end;
  byte *local_58;
  byte *pos;
  Vector<unsigned_char> unpacked;
  Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
  *checkUnpacked_local;
  CompilerMain *this_local;
  ArrayPtr<const_unsigned_char> prefix_local;
  
  prefix_local.ptr = (uchar *)prefix.size_;
  this_local = (CompilerMain *)prefix.ptr;
  unpacked.builder.disposer = (ArrayDisposer *)checkUnpacked;
  kj::Vector<unsigned_char>::Vector((Vector<unsigned_char> *)&pos);
  local_58 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  _i = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&this_local);
  if (0x400 < (long)_i - (long)local_58) {
    _i = local_58 + 0x400;
  }
  while (local_58 < _i) {
    b = *local_58;
    local_58 = local_58 + 1;
    for (local_78 = 0; local_78 < 8 && local_58 < _i; local_78 = local_78 + 1) {
      if (((uint)b & 1 << ((byte)local_78 & 0x1f)) == 0) {
        local_84 = 0;
        kj::Vector<unsigned_char>::add<int>((Vector<unsigned_char> *)&pos,&local_84);
      }
      else {
        local_79 = *local_58;
        if (local_79 == 0) {
          prefix_local.size_._4_4_ = IMPOSSIBLE;
          local_58 = local_58 + 1;
          goto LAB_0013e9b2;
        }
        local_58 = local_58 + 1;
        kj::Vector<unsigned_char>::add<unsigned_char&>((Vector<unsigned_char> *)&pos,&local_79);
      }
    }
    if (local_58 == _i) break;
    if (b == '\0') {
      bVar1 = *local_58;
      local_88 = (uint)bVar1 << 3;
      available._7_1_ = 0;
      local_58 = local_58 + 1;
      RVar3 = kj::repeat<unsigned_char>((uchar *)((long)&available + 7),(ulong)bVar1 << 3);
      local_90 = RVar3.count;
      count_1._0_1_ = RVar3.value;
      kj::Vector<unsigned_char>::addAll<kj::Repeat<unsigned_char>>
                ((Vector<unsigned_char> *)&pos,(Repeat<unsigned_char> *)&count_1);
    }
    else if (b == 0xff) {
      available._0_4_ = (uint)*local_58 << 3;
      uStack_a8 = (long)_i - (long)(local_58 + 1);
      local_58 = local_58 + 1;
      WVar2 = kj::min<unsigned_int&,unsigned_long&>((uint *)&available,&stack0xffffffffffffff58);
      kj::Vector<unsigned_char>::addAll<unsigned_char_const*>
                ((Vector<unsigned_char> *)&pos,local_58,local_58 + (WVar2 & 0xffffffff));
      local_58 = local_58 + (WVar2 & 0xffffffff);
    }
  }
  params = kj::Vector::operator_cast_to_ArrayPtr((Vector *)&pos);
  prefix_local.size_._4_4_ =
       kj::Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
       ::operator()(checkUnpacked,params);
LAB_0013e9b2:
  count = 1;
  kj::Vector<unsigned_char>::~Vector((Vector<unsigned_char> *)&pos);
  return prefix_local.size_._4_4_;
}

Assistant:

Plausibility isPlausiblyPacked(kj::ArrayPtr<const byte> prefix,
      kj::Function<Plausibility(kj::ArrayPtr<const byte>)> checkUnpacked) {
    kj::Vector<byte> unpacked;

    // Try to unpack a prefix so that we can check it.
    const byte* pos = prefix.begin();
    const byte* end = prefix.end();
    if (end - pos > 1024) {
      // Don't bother unpacking more than 1k.
      end = pos + 1024;
    }
    while (pos < end) {
      byte tag = *pos++;
      for (uint i = 0; i < 8 && pos < end; i++) {
        if (tag & (1 << i)) {
          byte b = *pos++;
          if (b == 0) {
            // A zero byte should have been deflated away.
            return IMPOSSIBLE;
          }
          unpacked.add(b);
        } else {
          unpacked.add(0);
        }
      }

      if (pos == end) {
        break;
      }

      if (tag == 0) {
        uint count = *pos++ * 8;
        unpacked.addAll(kj::repeat(byte(0), count));
      } else if (tag == 0xff) {
        uint count = *pos++ * 8;
        size_t available = end - pos;
        uint n = kj::min(count, available);
        unpacked.addAll(pos, pos + n);
        pos += n;
      }
    }

    return checkUnpacked(unpacked);
  }